

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::operator=(DecimalQuantity *this,DecimalQuantity *other)

{
  if (this != other) {
    copyBcdFrom(this,other);
    copyFieldsFrom(this,other);
  }
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::operator=(const DecimalQuantity &other) {
    if (this == &other) {
        return *this;
    }
    copyBcdFrom(other);
    copyFieldsFrom(other);
    return *this;
}